

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::update
          (Model *this,vector<int,_std::allocator<int>_> *input,
          vector<int,_std::allocator<int>_> *targets,int32_t targetIndex,real lr,State *state)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  reference piVar4;
  uint in_ECX;
  undefined8 in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Vector *in_RDI;
  State *in_R8;
  real in_XMM0_Da;
  undefined1 auVar5 [16];
  const_iterator it;
  real lossValue;
  Vector *grad;
  element_type *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb8;
  real a;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc0;
  State *in_stack_ffffffffffffffd0;
  Vector *pVVar6;
  
  a = (real)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar2 != 0) {
    computeHidden((Model *)CONCAT44(in_ECX,in_XMM0_Da),(vector<int,_std::allocator<int>_> *)in_R8,
                  in_stack_ffffffffffffffd0);
    pVVar6 = &in_R8->grad;
    Vector::zero(in_RDI);
    peVar3 = std::__shared_ptr_access<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x191ccb);
    (*peVar3->_vptr_Loss[2])(peVar3,in_RDX,(ulong)in_ECX,in_R8,1);
    auVar5 = ZEXT416((uint)in_XMM0_Da);
    State::incrementNExamples(in_R8,in_XMM0_Da);
    if (((ulong)in_RDI[2].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
      vcvtusi2sd_avx512f(auVar5,sVar2);
      Vector::mul((Vector *)in_stack_ffffffffffffffc0._M_current,a);
    }
    std::vector<int,_std::allocator<int>_>::cbegin
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::cend
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffffa0 = pVVar6;
      in_stack_ffffffffffffff98 =
           std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x191d80);
      pVVar6 = in_stack_ffffffffffffffa0;
      piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &stack0xffffffffffffffc0);
      (*in_stack_ffffffffffffff98->_vptr_Matrix[3])
                (SUB648(ZEXT464(0x3f800000),0),in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                 (long)*piVar4);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void Model::update(
    const std::vector<int32_t>& input,
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    real lr,
    State& state) {
  if (input.size() == 0) {
    return;
  }
  computeHidden(input, state);

  Vector& grad = state.grad;
  grad.zero();
  real lossValue = loss_->forward(targets, targetIndex, state, lr, true);
  state.incrementNExamples(lossValue);

  if (normalizeGradient_) {
    grad.mul(1.0 / input.size());
  }
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    wi_->addVectorToRow(grad, *it, 1.0);
  }
}